

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

AMQP_VALUE amqpvalue_get_inplace_described_value(AMQP_VALUE value)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  AMQP_VALUE result;
  AMQP_VALUE value_local;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_inplace_described_value",0x1c10,1,"NULL value");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((value->type == AMQP_TYPE_DESCRIBED) || (value->type == AMQP_TYPE_COMPOSITE)) {
    l = (LOGGER_LOG)(value->value).described_value.value;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_inplace_described_value",0x1c19,1,
                "Type is not described or composite");
    }
    l = (LOGGER_LOG)0x0;
  }
  return (AMQP_VALUE)l;
}

Assistant:

AMQP_VALUE amqpvalue_get_inplace_described_value(AMQP_VALUE value)
{
    AMQP_VALUE result;

    if (value == NULL)
    {
        LogError("NULL value");
        result = NULL;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if ((value_data->type != AMQP_TYPE_DESCRIBED) &&
            (value_data->type != AMQP_TYPE_COMPOSITE))
        {
            LogError("Type is not described or composite");
            result = NULL;
        }
        else
        {
            result = value_data->value.described_value.value;
        }
    }

    return result;
}